

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uint duckdb::Cast::Operation<duckdb::string_t,unsigned_int>(string_t input)

{
  string_t input_00;
  bool bVar1;
  InvalidInputException *this;
  anon_union_16_2_67f50693_for_value in_stack_00000040;
  uint result;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  uint32_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c [12];
  uint local_14;
  
  input_00.value.inlined.inlined = (char  [12])in_stack_ffffffffffffff9c;
  input_00.value.pointer.length = in_stack_ffffffffffffff98;
  bVar1 = TryCast::Operation<duckdb::string_t,unsigned_int>
                    (input_00,in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::string_t,unsigned_int>((string_t)in_stack_00000040);
    InvalidInputException::InvalidInputException
              (this,(string *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_14;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}